

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

int tga_readheader(FILE *fp,uint *bits_per_pixel,uint *width,uint *height,int *flip_image)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  int iVar4;
  size_t sVar5;
  void *__ptr;
  uchar *id;
  unsigned_short image_h;
  unsigned_short image_w;
  unsigned_short cmap_entry_size;
  unsigned_short cmap_len;
  uchar image_desc;
  uchar pixel_depth;
  uchar image_type;
  uchar id_len;
  uchar tga [18];
  int palette_size;
  int *flip_image_local;
  uint *height_local;
  uint *width_local;
  uint *bits_per_pixel_local;
  FILE *fp_local;
  
  if ((((bits_per_pixel == (uint *)0x0) || (width == (uint *)0x0)) || (height == (uint *)0x0)) ||
     (flip_image == (int *)0x0)) {
    fp_local._4_4_ = 0;
  }
  else {
    sVar5 = fread(&cmap_entry_size,0x12,1,(FILE *)fp);
    if (sVar5 == 1) {
      uVar1 = get_tga_ushort(&pixel_depth);
      uVar2 = get_tga_ushort(tga + 4);
      uVar3 = get_tga_ushort(tga + 6);
      *bits_per_pixel = (uint)tga[8];
      *width = (uint)uVar2;
      *height = (uint)uVar3;
      if ((byte)cmap_entry_size != 0) {
        __ptr = malloc((ulong)(byte)cmap_entry_size);
        if (__ptr == (void *)0x0) {
          fprintf(_stderr,"tga_readheader: memory out\n");
          return 0;
        }
        sVar5 = fread(__ptr,(ulong)(byte)cmap_entry_size,1,(FILE *)fp);
        if (sVar5 == 0) {
          fprintf(_stderr,"\nError: fread return a number of element different from the expected.\n"
                 );
          free(__ptr);
          return 0;
        }
        free(__ptr);
      }
      if ((byte)cmap_len < 9) {
        *flip_image = (uint)(((tga[9] & 0x20) != 0 ^ 0xffU) & 1);
        iVar4 = (uint)uVar1 * ((ushort)id_len / 8);
        if (iVar4 != 0) {
          fprintf(_stderr,"File contains a palette - not yet supported.",(ulong)(ushort)id_len % 8);
          fseek((FILE *)fp,(long)iVar4,1);
        }
        fp_local._4_4_ = 1;
      }
      else {
        fprintf(_stderr,"Sorry, compressed tga files are not currently supported.\n");
        fp_local._4_4_ = 0;
      }
    }
    else {
      fprintf(_stderr,"\nError: fread return a number of element different from the expected.\n");
      fp_local._4_4_ = 0;
    }
  }
  return fp_local._4_4_;
}

Assistant:

static int tga_readheader(FILE *fp, unsigned int *bits_per_pixel,
                          unsigned int *width, unsigned int *height, int *flip_image)
{
    int palette_size;
    unsigned char tga[TGA_HEADER_SIZE];
    unsigned char id_len, /*cmap_type,*/ image_type;
    unsigned char pixel_depth, image_desc;
    unsigned short /*cmap_index,*/ cmap_len, cmap_entry_size;
    unsigned short /*x_origin, y_origin,*/ image_w, image_h;

    if (!bits_per_pixel || !width || !height || !flip_image) {
        return 0;
    }

    if (fread(tga, TGA_HEADER_SIZE, 1, fp) != 1) {
        fprintf(stderr,
                "\nError: fread return a number of element different from the expected.\n");
        return 0 ;
    }
    id_len = tga[0];
    /*cmap_type = tga[1];*/
    image_type = tga[2];
    /*cmap_index = get_tga_ushort(&tga[3]);*/
    cmap_len = get_tga_ushort(&tga[5]);
    cmap_entry_size = tga[7];


#if 0
    x_origin = get_tga_ushort(&tga[8]);
    y_origin = get_tga_ushort(&tga[10]);
#endif
    image_w = get_tga_ushort(&tga[12]);
    image_h = get_tga_ushort(&tga[14]);
    pixel_depth = tga[16];
    image_desc  = tga[17];

    *bits_per_pixel = (unsigned int)pixel_depth;
    *width  = (unsigned int)image_w;
    *height = (unsigned int)image_h;

    /* Ignore tga identifier, if present ... */
    if (id_len) {
        unsigned char *id = (unsigned char *) malloc(id_len);
        if (id == 0) {
            fprintf(stderr, "tga_readheader: memory out\n");
            return 0;
        }
        if (!fread(id, id_len, 1, fp)) {
            fprintf(stderr,
                    "\nError: fread return a number of element different from the expected.\n");
            free(id);
            return 0 ;
        }
        free(id);
    }

    /* Test for compressed formats ... not yet supported ...
    // Note :-  9 - RLE encoded palettized.
    //         10 - RLE encoded RGB. */
    if (image_type > 8) {
        fprintf(stderr, "Sorry, compressed tga files are not currently supported.\n");
        return 0 ;
    }

    *flip_image = !(image_desc & 32);

    /* Palettized formats are not yet supported, skip over the palette, if present ... */
    palette_size = cmap_len * (cmap_entry_size / 8);

    if (palette_size > 0) {
        fprintf(stderr, "File contains a palette - not yet supported.");
        fseek(fp, palette_size, SEEK_CUR);
    }
    return 1;
}